

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
libcellml::Validator::ValidatorImpl::validateEquivalenceUnits
          (ValidatorImpl *this,ModelPtr *model,VariablePtr *variable,VariableMap *alreadyReported)

{
  shared_ptr<libcellml::VariablePair> *psVar1;
  IssueImpl *this_00;
  _Alloc_hider _Var2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  _Var6;
  long lVar7;
  ulong uVar8;
  __normal_iterator<std::shared_ptr<libcellml::VariablePair>_*,_std::vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>_>
  __it;
  VariablePtr equivalentVariable;
  IssuePtr err;
  ComponentPtr equivalentComponent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  ValidatorImpl *local_310;
  ulong local_308;
  ModelPtr *local_300;
  undefined1 local_2f8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  double multiplier;
  ComponentPtr parentComponent;
  VariablePairPtr pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string hints;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  anon_class_32_2_f86da958_for__M_pred local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  hints._M_dataplus._M_p = (pointer)&hints.field_2;
  hints._M_string_length = 0;
  hints.field_2._M_local_buf[0] = '\0';
  local_310 = this;
  local_300 = model;
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&local_330,
             &variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  owningComponent((ParentedEntityConstPtr *)&parentComponent);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
  Variable::units((Variable *)&local_330);
  _Var2._M_p = local_330._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
  if (_Var2._M_p != (pointer)0x0) {
    uVar8 = 0;
    while( true ) {
      sVar4 = Variable::equivalentVariableCount
                        ((variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                        );
      if (sVar4 <= uVar8) break;
      Variable::equivalentVariable
                ((Variable *)&equivalentVariable,
                 (size_t)(variable->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libcellml::Variable,void>
                ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)
                 &local_330,
                 (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
                 &equivalentVariable);
      owningComponent((ParentedEntityConstPtr *)&equivalentComponent);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
      if ((equivalentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (bVar3 = ImportedEntity::isImport
                            (&(equivalentComponent.
                               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ImportedEntity), !bVar3)) {
        Variable::units((Variable *)&local_330);
        _Var2._M_p = local_330._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_330._M_string_length);
        if (_Var2._M_p != (pointer)0x0) {
          multiplier = 0.0;
          bVar3 = unitsAreEquivalent(local_300,variable,&equivalentVariable,&hints,&multiplier);
          if (!bVar3) {
            __it._M_current =
                 (alreadyReported->
                 super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
            psVar1 = (alreadyReported->
                     super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_308 = uVar8;
            std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)&local_1b0,
                       &equivalentVariable.
                        super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
            std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_1b0.variable.
                        super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>,
                       &variable->
                        super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::__0((__0 *)&local_2b0,&local_1b0);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::__0((__0 *)&local_330,(anon_class_32_2_f86da958_for__M_pred *)&local_2b0);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::__0((__0 *)&local_290,(anon_class_32_2_f86da958_for__M_pred *)&local_330);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::~__0((__0 *)&local_330);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::__0((__0 *)&local_330,(anon_class_32_2_f86da958_for__M_pred *)&local_290);
            lVar7 = (long)psVar1 - (long)__it._M_current;
            for (lVar5 = lVar7 >> 6; _Var6._M_current = __it._M_current, 0 < lVar5;
                lVar5 = lVar5 + -1) {
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&local_330,__it);
              if (bVar3) goto LAB_002256c5;
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&local_330,__it._M_current + 1);
              _Var6._M_current = __it._M_current + 1;
              if (bVar3) goto LAB_002256c5;
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&local_330,__it._M_current + 2);
              _Var6._M_current = __it._M_current + 2;
              if (bVar3) goto LAB_002256c5;
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&local_330,__it._M_current + 3);
              _Var6._M_current = __it._M_current + 3;
              if (bVar3) goto LAB_002256c5;
              __it._M_current = __it._M_current + 4;
              lVar7 = lVar7 + -0x40;
            }
            lVar7 = lVar7 >> 4;
            if (lVar7 == 1) {
LAB_002256ac:
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&local_330,__it);
              _Var6._M_current = psVar1;
              if (bVar3) {
                _Var6._M_current = __it._M_current;
              }
            }
            else if (lVar7 == 2) {
LAB_00225687:
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                      ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                    *)&local_330,_Var6);
              if (!bVar3) {
                __it._M_current = _Var6._M_current + 1;
                goto LAB_002256ac;
              }
            }
            else {
              _Var6._M_current = psVar1;
              if ((lVar7 == 3) &&
                 (bVar3 = __gnu_cxx::__ops::
                          _Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::$_0>
                          ::operator()((_Iter_pred<libcellml::Validator::ValidatorImpl::validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)::__0>
                                        *)&local_330,__it), _Var6._M_current = __it._M_current,
                 !bVar3)) {
                _Var6._M_current = __it._M_current + 1;
                goto LAB_00225687;
              }
            }
LAB_002256c5:
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::~__0((__0 *)&local_330);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::~__0((__0 *)&local_290);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::~__0((__0 *)&local_2b0);
            validateEquivalenceUnits(std::shared_ptr<libcellml::Model>const&,std::shared_ptr<libcellml::Variable>const&,std::vector<std::shared_ptr<libcellml::VariablePair>,std::allocator<std::shared_ptr<libcellml::VariablePair>>>&)
            ::$_0::~__0((__0 *)&local_1b0);
            uVar8 = local_308;
            if (_Var6._M_current ==
                (alreadyReported->
                super__Vector_base<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              VariablePair::create((VariablePair *)&pair,variable,&equivalentVariable);
              std::
              vector<std::shared_ptr<libcellml::VariablePair>,_std::allocator<std::shared_ptr<libcellml::VariablePair>_>_>
              ::push_back(alreadyReported,&pair);
              Issue::IssueImpl::create();
              this_00 = (err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        )->mPimpl;
              NamedEntity::name_abi_cxx11_
                        (&local_f0,
                         &((variable->
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_NamedEntity);
              std::operator+(&local_d0,"Variable \'",&local_f0);
              std::operator+(&local_250,&local_d0,"\' in component \'");
              NamedEntity::name_abi_cxx11_
                        (&local_110,
                         (NamedEntity *)
                         parentComponent.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
              std::operator+(&local_b0,&local_250,&local_110);
              std::operator+(&local_230,&local_b0,"\' has units of \'");
              Variable::units((Variable *)(local_2f8 + 0x10));
              NamedEntity::name_abi_cxx11_(&local_130,(NamedEntity *)local_2f8._16_8_);
              std::operator+(&local_90,&local_230,&local_130);
              std::operator+(&local_210,&local_90,"\' and an equivalent variable \'");
              NamedEntity::name_abi_cxx11_
                        (&local_150,
                         &(equivalentVariable.
                           super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_NamedEntity);
              std::operator+(&local_70,&local_210,&local_150);
              std::operator+(&local_1f0,&local_70,"\' in component \'");
              NamedEntity::name_abi_cxx11_
                        (&local_170,
                         (NamedEntity *)
                         equivalentComponent.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
              std::operator+(&local_50,&local_1f0,&local_170);
              std::operator+(&local_1d0,&local_50,"\' with non-matching units of \'");
              Variable::units((Variable *)local_2f8);
              NamedEntity::name_abi_cxx11_(&local_190,(NamedEntity *)local_2f8._0_8_);
              std::operator+(&local_2b0,&local_1d0,&local_190);
              std::operator+(&local_290,&local_2b0,"\'. The mismatch is: ");
              std::operator+(&local_330,&local_290,&hints);
              Issue::IssueImpl::setDescription(this_00,&local_330);
              std::__cxx11::string::~string((string *)&local_330);
              std::__cxx11::string::~string((string *)&local_290);
              std::__cxx11::string::~string((string *)&local_2b0);
              std::__cxx11::string::~string((string *)&local_190);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2f8 + 8));
              std::__cxx11::string::~string((string *)&local_1d0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_210);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_130);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0);
              std::__cxx11::string::~string((string *)&local_230);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_250);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_f0);
              AnyCellmlElement::AnyCellmlElementImpl::setMapVariables
                        ((((err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->mPimpl->mItem).
                          super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->mPimpl,variable,&equivalentVariable);
              Issue::IssueImpl::setReferenceRule
                        ((err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,MAP_VARIABLES_ELEMENT);
              Logger::LoggerImpl::addIssue(&local_310->super_LoggerImpl,&err);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&err.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&pair.
                          super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&equivalentComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&equivalentVariable.
                  super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      uVar8 = uVar8 + 1;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parentComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&hints);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateEquivalenceUnits(const ModelPtr &model, const VariablePtr &variable, VariableMap &alreadyReported)
{
    std::string hints;
    ComponentPtr parentComponent = owningComponent(variable);

    if (variable->units() == nullptr) {
        // If the variable has no units, don't check it.
        return;
    }

    for (size_t index = 0; index < variable->equivalentVariableCount(); ++index) {
        auto equivalentVariable = variable->equivalentVariable(index);

        // If the parent component of the variable is nonexistent or imported, don't check it.
        auto equivalentComponent = owningComponent(equivalentVariable);
        if ((equivalentComponent == nullptr) || equivalentComponent->isImport()) {
            continue;
        }

        // If the equivalent variable has no units, don't check it.
        if (equivalentVariable->units() == nullptr) {
            continue;
        }

        double multiplier = 0.0;
        if (!unitsAreEquivalent(model, variable, equivalentVariable, hints, multiplier)) {
            auto it = std::find_if(alreadyReported.begin(), alreadyReported.end(),
                                   [equivalentVariable, variable](const VariablePairPtr &in) {
                                       return (in->variable1() == equivalentVariable) && (in->variable2() == variable);
                                   });
            if (it == alreadyReported.end()) {
                VariablePairPtr pair = VariablePair::create(variable, equivalentVariable);
                alreadyReported.push_back(pair);
                IssuePtr err = Issue::IssueImpl::create();
                err->mPimpl->setDescription("Variable '" + variable->name() + "' in component '" + parentComponent->name() + "' has units of '" + variable->units()->name() + "' and an equivalent variable '" + equivalentVariable->name() + "' in component '" + equivalentComponent->name() + "' with non-matching units of '" + equivalentVariable->units()->name() + "'. The mismatch is: " + hints);
                err->mPimpl->mItem->mPimpl->setMapVariables(variable, equivalentVariable);
                err->mPimpl->setReferenceRule(Issue::ReferenceRule::MAP_VARIABLES_ELEMENT);
                addIssue(err);
            }
        }
    }
}